

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

double * seasdummy(double *x,int N,int f,int *rows,int *cols)

{
  size_t __size;
  double dVar1;
  uint N_00;
  void *__ptr;
  void *__ptr_00;
  double *A;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  if (f < 2) {
    puts("Non-Seasonal Data ");
    exit(-1);
  }
  __size = (long)N * 8;
  __ptr = malloc(__size);
  uVar3 = (ulong)(uint)f;
  __ptr_00 = malloc(uVar3 * (long)N * 0x10);
  N_00 = f - 1;
  A = (double *)malloc(__size * N_00);
  if (0 < N) {
    uVar7 = (ulong)(uint)N;
    uVar2 = 0;
    do {
      uVar4 = uVar2 + 1;
      *(double *)((long)__ptr + uVar2 * 8) = (double)(int)uVar4;
      uVar2 = uVar4;
    } while (uVar7 != uVar4);
    if (0 < N) {
      pdVar5 = (double *)((long)__ptr_00 + 8);
      lVar9 = 0;
      uVar2 = 0;
      do {
        dVar1 = *(double *)((long)__ptr + uVar2 * 8);
        uVar4 = 1;
        pdVar6 = pdVar5;
        lVar8 = lVar9;
        do {
          dVar10 = ((double)(int)uVar4 * 6.283185307179586 * dVar1) / (double)f;
          dVar11 = sin(dVar10);
          *pdVar6 = dVar11;
          dVar10 = cos(dVar10);
          *(double *)((long)__ptr_00 + (lVar8 >> 0x1d)) = dVar10;
          uVar4 = uVar4 + 1;
          pdVar6 = pdVar6 + 2;
          lVar8 = lVar8 + 0x200000000;
        } while (f + 1 != uVar4);
        uVar2 = uVar2 + 1;
        pdVar5 = pdVar5 + uVar3 * 2;
        lVar9 = lVar9 + (uVar3 << 0x21);
      } while (uVar2 != uVar7);
      printf("PIVAL %g",0x400921fb54442d18);
      if (0 < N) {
        uVar3 = 0;
        pdVar5 = A;
        do {
          memcpy(pdVar5,(void *)((long)__ptr_00 + uVar3 * 8),(ulong)N_00 * 8);
          pdVar5 = pdVar5 + (int)N_00;
          uVar3 = (ulong)(uint)((int)uVar3 + f * 2);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      goto LAB_0014cb51;
    }
  }
  printf("PIVAL %g",0x400921fb54442d18);
LAB_0014cb51:
  itranspose(A,N,N_00);
  *rows = N_00;
  *cols = N;
  free(__ptr);
  free(__ptr_00);
  return A;
}

Assistant:

double* seasdummy(double *x, int N,int f,int *rows, int *cols) {
    int i,j,iter;
    double *tt;
    double *fmatrix,*oup;
    if ( f <= 1) {
        printf("Non-Seasonal Data \n");
        exit(-1);
    }

    tt = (double*) malloc(sizeof(double)*N);
    fmatrix = (double*)malloc(sizeof(double)*N*2*f);
    oup = (double*)malloc(sizeof(double)*N*(f-1));

    for(i = 0; i < N;++i) {
        tt[i] = (double) i + 1;
    }

    for(i = 0; i < N; ++i) {
        iter = i * 2 * f;
        for(j = 1; j <= f; ++j) {
            fmatrix[iter + 2 * j - 1 ] = sin(2 * (double) PIVAL * j * tt[i] / (double) f);
            fmatrix[iter + 2 * (j - 1) ] = cos(2 * (double) PIVAL * j * tt[i] /(double) f);
            //printf("%d %d \n",iter + 2 * j,iter + 2 * j+1);
        }
    }

    printf("PIVAL %g",PIVAL);

    //mdisplay(fmatrix,N,2*f);

    for(i = 0; i < N;++i) {
        memcpy(oup + i * (f-1),fmatrix + i * 2 * f,sizeof(double)* (f-1));
    }

    itranspose(oup,N,f-1);

    *rows = f-1;
    *cols = N;

    free(tt);
    free(fmatrix);
    return oup;
}